

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O2

Vec_Bit_t * Acec_MapXorOuts(Gia_Man_t *p,Vec_Int_t *vXors)

{
  int i;
  Vec_Bit_t *p_00;
  int Entry;
  int i_00;
  
  p_00 = Vec_BitStart(p->nObjs);
  for (i_00 = 0; i_00 < vXors->nSize; i_00 = i_00 + 4) {
    i = Vec_IntEntry(vXors,i_00);
    Vec_BitWriteEntry(p_00,i,Entry);
  }
  return p_00;
}

Assistant:

Vec_Bit_t * Acec_MapXorOuts( Gia_Man_t * p, Vec_Int_t * vXors )
{
    Vec_Bit_t * vMap = Vec_BitStart( Gia_ManObjNum(p) ); int i;
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vXors, 4*i), 1 );
    return vMap;
}